

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Wrap *ty)

{
  int iVar1;
  Wrap *ty_local;
  string *s;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  iVar1 = *(int *)this;
  if (iVar1 == 0) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"nonperiodic");
  }
  else if (iVar1 == 1) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"periodic");
  }
  else if (iVar1 == 2) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"pinned");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomBasisCurves::Wrap &ty) {
  std::string s;

  switch (ty) {
    case GeomBasisCurves::Wrap::Nonperiodic: {
      s = "nonperiodic";
      break;
    }
    case GeomBasisCurves::Wrap::Periodic: {
      s = "periodic";
      break;
    }
    case GeomBasisCurves::Wrap::Pinned: {
      s = "pinned";
      break;
    }
  }

  return s;
}